

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.hpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
ranges::detail::to_container::fn<meta::id<std::vector<double,std::allocator<double>>>>::
impl<std::vector<double,std::allocator<double>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::vector<double,std::allocator<double>>>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          fn<meta::id<std::vector<double,std::allocator<double>>>> *this)

{
  vector<double,_std::allocator<double>_> local_28;
  
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::reserve
            (&local_28,*(long *)(this + 8) - *(long *)this >> 3);
  std::vector<double,std::allocator<double>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((vector<double,std::allocator<double>> *)&local_28,*(undefined8 *)this,
             *(undefined8 *)(this + 8));
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  return __return_storage_ptr__;
}

Assistant:

static auto impl(Rng && rng, std::true_type)
            {
                Cont c;
                auto const rng_size = ranges::size(rng);
                using size_type = decltype(c.max_size());
                using C = common_type_t<range_size_t<Rng>, size_type>;
                RANGES_EXPECT(static_cast<C>(rng_size) <= static_cast<C>(c.max_size()));
                c.reserve(static_cast<size_type>(rng_size));
                c.assign(I{ranges::begin(rng)}, I{ranges::end(rng)});
                return c;
            }